

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O1

void burstsort2_sampling_vector_block(uchar **strings,size_t n)

{
  uchar *puVar1;
  ulong uVar2;
  bool bVar3;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *pTVar4;
  undefined8 *puVar5;
  pointer ppvVar6;
  vector_block<unsigned_char_*,_128U> *this;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *pTVar7;
  int iVar8;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  _func_void_uchar_ptr_ptr_int_int *p_Var9;
  long lVar10;
  uint index;
  ulong uVar12;
  size_t depth;
  byte bVar13;
  long lVar14;
  uchar *str;
  BurstSimple<unsigned_char> local_59;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *local_58;
  _func_void_uchar_ptr_ptr_int_int *local_50;
  uchar **local_48;
  _func_void_uchar_ptr_ptr_int_int *local_40;
  byte *local_38;
  _func_void_uchar_ptr_ptr_int_int *p_Var11;
  
  local_48 = strings;
  pTVar4 = (TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *)operator_new(0x18);
  (pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = (_func_void_uchar_ptr_ptr_int_int *)n;
  if (n != 0) {
    lVar10 = 5000;
    in_RCX = (_func_void_uchar_ptr_ptr_int_int *)0x0;
    local_58 = pTVar4;
    do {
      puVar1 = local_48[(long)in_RCX];
      local_40 = in_RCX;
      if (puVar1 == (uchar *)0x0) goto LAB_001a1a48;
      lVar14 = 0;
      pTVar4 = local_58;
      do {
        bVar13 = puVar1[lVar14];
        uVar12 = (ulong)bVar13;
        if (bVar13 == 0) {
          bVar3 = false;
          iVar8 = 6;
        }
        else {
          if ((ulong)((long)(pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) < uVar12 + 1) {
            std::vector<void_*,_std::allocator<void_*>_>::resize(&pTVar4->_buckets,uVar12 + 1);
          }
          lVar14 = lVar14 + 1;
          ppvVar6 = (pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((ulong)((long)(pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar6 >> 3) <=
               uVar12) || (((ulong)ppvVar6[uVar12] & 1) == 0)) {
            puVar5 = (undefined8 *)operator_new(0x18);
            *puVar5 = 0;
            puVar5[1] = 0;
            puVar5[2] = 0;
            *(undefined8 **)
             ((long)(pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start + (ulong)((uint)bVar13 * 8)) = puVar5;
            ppvVar6 = (pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                      .super__Vector_impl_data._M_start;
            uVar2 = *(ulong *)((long)ppvVar6 + (ulong)((uint)bVar13 * 8));
            if (uVar2 == 0) goto LAB_001a1a0a;
            ppvVar6[uVar12] = (void *)(uVar2 | 1);
            lVar10 = lVar10 + -1;
            if (lVar10 == 0) {
              bVar3 = false;
              iVar8 = 7;
              lVar10 = 0;
              goto LAB_001a1884;
            }
          }
          pTVar4 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::get_node
                             (pTVar4,(uint)bVar13);
          if (pTVar4 == (TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *)0x0) {
            __assert_fail("node",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0xd9,
                          "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned char, BucketT = vector_block<unsigned char *, 128>]"
                         );
          }
          iVar8 = 0;
          bVar3 = true;
        }
LAB_001a1884:
      } while (iVar8 == 0);
      if (iVar8 == 6) {
        bVar3 = true;
      }
      in_RCX = local_40 + 0x2000;
    } while ((in_RCX < local_50) && (bVar3));
    pTVar4 = local_58;
    if (local_50 != (_func_void_uchar_ptr_ptr_int_int *)0x0) {
      p_Var9 = (_func_void_uchar_ptr_ptr_int_int *)0x0;
      do {
        local_38 = local_48[(long)p_Var9];
        if (local_38 == (byte *)0x0) {
LAB_001a1a48:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x26,"unsigned char get_char(unsigned char *, size_t)");
        }
        bVar13 = *local_38;
        p_Var11 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)bVar13;
        index = (uint)bVar13;
        ppvVar6 = (local_58->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                 ((long)(local_58->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar6 >> 3);
        depth = 1;
        pTVar4 = local_58;
        if (p_Var11 < in_RCX) {
          lVar10 = 0;
          do {
            if (((ulong)ppvVar6[(long)p_Var11] & 1) == 0) break;
            if (bVar13 == 0) {
              __assert_fail("not is_end(c)",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                            ,0xeb,
                            "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_block<unsigned char *, 128>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                           );
            }
            pTVar4 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::get_node
                               (pTVar4,(uint)p_Var11);
            if (local_38 == (byte *)0x0) goto LAB_001a1a48;
            bVar13 = local_38[lVar10 + 1];
            lVar10 = lVar10 + 1;
            p_Var11 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)bVar13;
            ppvVar6 = (pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                      .super__Vector_impl_data._M_start;
            in_RCX = (_func_void_uchar_ptr_ptr_int_int *)
                     ((long)(pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar6 >> 3);
          } while (p_Var11 < in_RCX);
          index = (uint)p_Var11;
          depth = lVar10 + 1;
        }
        this = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::get_bucket
                         (pTVar4,index);
        if (this == (vector_block<unsigned_char_*,_128U> *)0x0) {
          __assert_fail("bucket",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0xf1,
                        "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_block<unsigned char *, 128>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                       );
        }
        vector_block<unsigned_char_*,_128U>::push_back(this,&local_38);
        if ((bVar13 != 0) &&
           (in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(ulong)this->_left_in_block,
           0x4000 < (ulong)(((long)(this->_index_block).
                                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->_index_block).
                                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                  ._M_impl.super__Vector_impl_data._M_start) * 0x10 - (long)in_RCX))
           ) {
          pTVar7 = BurstSimple<unsigned_char>::operator()(&local_59,this,depth);
          in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(ulong)bVar13;
          *(TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> **)
           ((long)(pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_start + (ulong)((uint)bVar13 * 8)) = pTVar7;
          ppvVar6 = (pTVar4->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar12 = *(ulong *)((long)ppvVar6 + (ulong)((uint)bVar13 * 8));
          if (uVar12 == 0) {
LAB_001a1a0a:
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                          ,0x5c,"void make_trie(void *&)");
          }
          ppvVar6[(long)in_RCX] = (void *)(uVar12 | 1);
          vector_block<unsigned_char_*,_128U>::~vector_block(this);
          operator_delete(this);
        }
        p_Var9 = p_Var9 + 1;
        pTVar4 = local_58;
      } while (p_Var9 != local_50);
    }
  }
  traverse<void(*)(unsigned_char**,int,int),vector_block<unsigned_char*,128u>,unsigned_char>
            (pTVar4,local_48,0,in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_vector_block(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_block<unsigned char*, 128> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}